

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void __thiscall
pixels::compareClose(pixels *this,pixels *o,exr_compression_t comp,char *otag,char *selftag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  pointer puVar8;
  int iVar9;
  ulong uVar10;
  pointer puVar11;
  pointer puVar12;
  uint16_t *puVar13;
  pointer puVar14;
  uint16_t *puVar15;
  pointer puVar16;
  int y1;
  pointer puVar17;
  uint uVar18;
  pointer puVar19;
  pointer puVar20;
  int x1_1;
  int iVar21;
  long lVar22;
  long lVar23;
  int x1;
  long lVar24;
  pointer puVar25;
  pointer puVar26;
  uint16_t unc [4] [4];
  uint16_t orig [4] [4];
  uint16_t local_78 [16];
  uint16_t local_58 [20];
  
  if (0 < this->_h) {
    iVar2 = 0;
    do {
      if (0 < this->_w) {
        lVar22 = 0;
        do {
          lVar24 = (long)this->_stride_x * (long)iVar2 + lVar22;
          iVar9 = (int)lVar22;
          compareExact((o->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar24],
                       (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar24],iVar9,iVar2,otag,selftag,"I"
                      );
          if (comp == EXR_COMPRESSION_PXR24) {
            uVar5 = (uint)(this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar24] >> 8;
            pcVar7 = (char *)(ulong)uVar5;
            if (2 < (((uint)(o->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar24] >> 8) - uVar5) + 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
              core_test_fail("delta < 2 && delta > -2",(char *)0x247,0x185b4d,pcVar7);
            }
          }
          else {
            compareExact((o->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar24],
                         (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar24],iVar9,iVar2,otag,selftag,"F");
          }
          lVar22 = lVar22 + 1;
        } while ((int)lVar22 < this->_w);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->_h);
  }
  if ((comp & ~EXR_COMPRESSION_RLE) == EXR_COMPRESSION_B44) {
    if (0 < this->_h) {
      uVar5 = 0;
      do {
        iVar2 = this->_w;
        if (0 < iVar2) {
          iVar9 = 0;
          do {
            puVar15 = local_58;
            puVar13 = local_78;
            iVar3 = this->_stride_x;
            uVar6 = this->_h - 1;
            pcVar7 = (char *)(ulong)uVar6;
            puVar11 = (o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar12 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar22 = 0;
            do {
              uVar18 = (uint)lVar22 | uVar5;
              if ((int)uVar6 < (int)uVar18) {
                uVar18 = uVar6;
              }
              lVar24 = 0;
              do {
                iVar21 = iVar9 + (int)lVar24;
                if (iVar2 + -1 < iVar21) {
                  iVar21 = iVar2 + -1;
                }
                iVar21 = iVar21 + uVar18 * iVar3;
                puVar15[lVar24] = puVar11[iVar21];
                puVar13[lVar24] = puVar12[iVar21];
                lVar24 = lVar24 + 1;
              } while (lVar24 != 4);
              lVar22 = lVar22 + 1;
              puVar15 = puVar15 + 4;
              puVar13 = puVar13 + 4;
            } while (lVar22 != 4);
            bVar1 = withinB44ErrorBounds((uint16_t (*) [4])local_58,(uint16_t (*) [4])local_78);
            if (!bVar1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
              core_test_fail("withinB44ErrorBounds (orig, unc)",(char *)0x263,0x185b4d,pcVar7);
            }
            lVar22 = 0;
            do {
              puVar15 = local_58;
              puVar13 = local_78;
              uVar6 = this->_h - 1;
              pcVar7 = (char *)(ulong)uVar6;
              iVar3 = this->_w + -1;
              iVar2 = this->_stride_x;
              puVar11 = o->rgba[lVar22].
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar12 = this->rgba[lVar22].
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar24 = 0;
              do {
                uVar18 = (uint)lVar24 | uVar5;
                if ((int)uVar6 < (int)uVar18) {
                  uVar18 = uVar6;
                }
                lVar23 = 0;
                do {
                  iVar21 = iVar9 + (int)lVar23;
                  if (iVar3 < iVar21) {
                    iVar21 = iVar3;
                  }
                  iVar21 = iVar21 + uVar18 * iVar2;
                  puVar15[lVar23] = puVar11[iVar21];
                  puVar13[lVar23] = puVar12[iVar21];
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 4);
                lVar24 = lVar24 + 1;
                puVar15 = puVar15 + 4;
                puVar13 = puVar13 + 4;
              } while (lVar24 != 4);
              bVar1 = withinB44ErrorBounds((uint16_t (*) [4])local_58,(uint16_t (*) [4])local_78);
              if (!bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
                core_test_fail("withinB44ErrorBounds (orig, unc)",(char *)0x272,0x185b4d,pcVar7);
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
            iVar9 = iVar9 + 4;
            iVar2 = this->_w;
          } while (iVar9 < iVar2);
        }
        uVar5 = uVar5 + 4;
      } while ((int)uVar5 < this->_h);
    }
  }
  else if ((comp & ~EXR_COMPRESSION_RLE) == EXR_COMPRESSION_DWAA) {
    if (0 < this->_h) {
      uVar5 = 0;
      do {
        if (0 < this->_w) {
          iVar2 = 0;
          do {
            pcVar7 = (char *)(ulong)uVar5;
            lVar24 = (long)(int)(this->_stride_x * uVar5 + iVar2);
            compareExact((o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar24],
                         (this->h).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar24],iVar2,uVar5,otag,selftag,"H");
            lVar22 = 0x58;
            do {
              bVar1 = withinDWAErrorBounds
                                (*(uint16_t *)
                                  (*(long *)((long)o->rgba + lVar22 + -0x58) + lVar24 * 2),
                                 *(uint16_t *)
                                  (*(long *)((long)this->rgba + lVar22 + -0x58) + lVar24 * 2));
              if (!bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
                core_test_fail("withinDWAErrorBounds (o.rgba[c][idx], rgba[c][idx])",(char *)0x285,
                               0x185b4d,pcVar7);
              }
              lVar22 = lVar22 + 0x18;
            } while (lVar22 != 0xb8);
            iVar2 = iVar2 + 1;
          } while (iVar2 < this->_w);
        }
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 < this->_h);
    }
  }
  else {
    uVar5 = this->_h;
    if (comp == EXR_COMPRESSION_PXR24) {
      if (0 < (int)uVar5) {
        iVar2 = 0;
        do {
          if (0 < this->_w) {
            lVar22 = 0;
            do {
              lVar24 = (long)this->_stride_x * (long)iVar2 + lVar22;
              iVar9 = (int)lVar22;
              compareExact((o->h).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],
                           (this->h).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],iVar9,iVar2,otag,selftag
                           ,"H");
              compareExact(o->rgba[0].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],
                           this->rgba[0].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],iVar9,iVar2,otag,selftag
                           ,"R");
              compareExact(o->rgba[1].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],
                           this->rgba[1].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],iVar9,iVar2,otag,selftag
                           ,"G");
              compareExact(o->rgba[2].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],
                           this->rgba[2].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],iVar9,iVar2,otag,selftag
                           ,"B");
              compareExact(o->rgba[3].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],
                           this->rgba[3].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar24],iVar9,iVar2,otag,selftag
                           ,"A");
              lVar22 = lVar22 + 1;
            } while ((int)lVar22 < this->_w);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < this->_h);
      }
    }
    else if (0 < (int)uVar5) {
      iVar2 = this->_stride_x;
      puVar11 = (o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar12 = o->rgba[0].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar14 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar16 = this->rgba[0].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar17 = o->rgba[1].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar19 = this->rgba[1].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar25 = o->rgba[2].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar26 = this->rgba[2].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar20 = o->rgba[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar8 = this->rgba[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        if (0 < this->_w) {
          pcVar7 = (char *)0x0;
          do {
            if (*(short *)(pcVar7 + (long)puVar11) != *(short *)(pcVar7 + (long)puVar14)) {
              core_test_fail("o.h[idx] == h[idx]",(char *)0x2a4,0x185b4d,pcVar7);
            }
            if (*(short *)(pcVar7 + (long)puVar12) != *(short *)(pcVar7 + (long)puVar16)) {
              core_test_fail("o.rgba[0][idx] == rgba[0][idx]",(char *)0x2a5,0x185b4d,pcVar7);
            }
            if (*(short *)(pcVar7 + (long)puVar17) != *(short *)(pcVar7 + (long)puVar19)) {
              core_test_fail("o.rgba[1][idx] == rgba[1][idx]",(char *)0x2a6,0x185b4d,pcVar7);
            }
            if (*(short *)(pcVar7 + (long)puVar25) != *(short *)(pcVar7 + (long)puVar26)) {
              core_test_fail("o.rgba[2][idx] == rgba[2][idx]",(char *)0x2a7,0x185b4d,pcVar7);
            }
            if (*(short *)(pcVar7 + (long)puVar20) != *(short *)(pcVar7 + (long)puVar8)) {
              core_test_fail("o.rgba[3][idx] == rgba[3][idx]",(char *)0x2a8,0x185b4d,pcVar7);
            }
            pcVar7 = pcVar7 + 2;
          } while ((char *)((ulong)(uint)this->_w * 2) != pcVar7);
        }
        uVar10 = uVar10 + 1;
        puVar11 = puVar11 + iVar2;
        puVar14 = puVar14 + iVar2;
        puVar12 = puVar12 + iVar2;
        puVar16 = puVar16 + iVar2;
        puVar17 = puVar17 + iVar2;
        puVar19 = puVar19 + iVar2;
        puVar25 = puVar25 + iVar2;
        puVar26 = puVar26 + iVar2;
        puVar20 = puVar20 + iVar2;
        puVar8 = puVar8 + iVar2;
      } while (uVar10 != uVar5);
    }
  }
  return;
}

Assistant:

void compareClose (
        const pixels&     o,
        exr_compression_t comp,
        const char*       otag,
        const char*       selftag) const
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;

                compareExact (o.i[idx], i[idx], x, y, otag, selftag, "I");

                if (comp == EXR_COMPRESSION_PXR24)
                {
                    union
                    {
                        uint32_t iv;
                        float    fv;
                    } a, b;
                    a.fv = o.f[idx];
                    b.fv = f[idx];
                    int32_t delta =
                        (int32_t) (a.iv >> 8) - (int32_t) (b.iv >> 8);
                    EXRCORE_TEST_LOCATION (delta < 2 && delta > -2, x, y);
                }
                else
                {
                    // b44 & dwa don't change floats
                    compareExact (o.f[idx], f[idx], x, y, otag, selftag, "F");
                }
            }
        }

        if (comp == EXR_COMPRESSION_B44 || comp == EXR_COMPRESSION_B44A)
        {
            uint16_t orig[4][4], unc[4][4];
            for (int y = 0; y < _h; y += 4)
            {
                for (int x = 0; x < _w; x += 4)
                {
                    for (int y1 = 0; y1 < 4; ++y1)
                    {
                        for (int x1 = 0; x1 < 4; ++x1)
                        {
                            int y2       = std::min (y + y1, _h - 1);
                            int x2       = std::min (x + x1, _w - 1);
                            orig[y1][x1] = o.h[y2 * _stride_x + x2];
                            unc[y1][x1]  = h[y2 * _stride_x + x2];
                        }
                    }
                    EXRCORE_TEST_LOCATION (
                        withinB44ErrorBounds (orig, unc), x, y)
                    for (int c = 0; c < 4; ++c)
                    {

                        for (int y1 = 0; y1 < 4; ++y1)
                        {
                            for (int x1 = 0; x1 < 4; ++x1)
                            {
                                int y2       = std::min (y + y1, _h - 1);
                                int x2       = std::min (x + x1, _w - 1);
                                orig[y1][x1] = o.rgba[c][y2 * _stride_x + x2];
                                unc[y1][x1]  = rgba[c][y2 * _stride_x + x2];
                            }
                        }
                        EXRCORE_TEST_LOCATION (
                            withinB44ErrorBounds (orig, unc), x, y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_DWAA || comp == EXR_COMPRESSION_DWAB)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");

                    for (int c = 0; c < 4; ++c)
                    {
                        EXRCORE_TEST_LOCATION (
                            withinDWAErrorBounds (o.rgba[c][idx], rgba[c][idx]),
                            x,
                            y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_PXR24)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");
                    compareExact (
                        o.rgba[0][idx], rgba[0][idx], x, y, otag, selftag, "R");
                    compareExact (
                        o.rgba[1][idx], rgba[1][idx], x, y, otag, selftag, "G");
                    compareExact (
                        o.rgba[2][idx], rgba[2][idx], x, y, otag, selftag, "B");
                    compareExact (
                        o.rgba[3][idx], rgba[3][idx], x, y, otag, selftag, "A");
                }
            }
        }
        else
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    EXRCORE_TEST (o.h[idx] == h[idx]);
                    EXRCORE_TEST (o.rgba[0][idx] == rgba[0][idx]);
                    EXRCORE_TEST (o.rgba[1][idx] == rgba[1][idx]);
                    EXRCORE_TEST (o.rgba[2][idx] == rgba[2][idx]);
                    EXRCORE_TEST (o.rgba[3][idx] == rgba[3][idx]);
                }
            }
        }
    }